

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O3

void test_xor_lazy(_Bool copy_on_write)

{
  _Bool _Var1;
  roaring_bitmap_t *prVar2;
  roaring_bitmap_t *prVar3;
  roaring_bitmap_t *prVar4;
  uint64_t uVar5;
  roaring_bitmap_t *r1;
  uint64_t uVar6;
  ulong uVar7;
  roaring_bitmap_t **pprVar8;
  int i_1;
  ulong uVar9;
  char *__format;
  int iVar10;
  uint32_t i;
  uint uVar11;
  roaring_bitmap_t *r [10];
  roaring_bitmap_t *local_80 [4];
  roaring_bitmap_t *local_60;
  roaring_bitmap_t *local_58;
  roaring_bitmap_t *local_50;
  roaring_bitmap_t *local_48;
  undefined8 local_40;
  
  uVar11 = 0;
  prVar2 = roaring_bitmap_create_with_capacity(0);
  (prVar2->high_low_container).flags = (prVar2->high_low_container).flags & 0xfe | copy_on_write;
  prVar3 = roaring_bitmap_create_with_capacity(0);
  (prVar3->high_low_container).flags = (prVar3->high_low_container).flags & 0xfe | copy_on_write;
  do {
    if ((uVar11 & 1) == 0) {
      roaring_bitmap_add(prVar2,uVar11);
    }
    if ((short)((short)((uVar11 & 0xffff) / 3) * -3 + (short)uVar11) == 0) {
      roaring_bitmap_add(prVar3,uVar11);
    }
    uVar11 = uVar11 + 1;
  } while (uVar11 != 300);
  prVar4 = roaring_bitmap_lazy_xor(prVar2,prVar3);
  roaring_bitmap_repair_after_lazy(prVar4);
  (prVar4->high_low_container).flags = (prVar4->high_low_container).flags & 0xfe | copy_on_write;
  iVar10 = 0;
  uVar11 = 0;
  do {
    if (((short)uVar11 == (ushort)(((ushort)((uVar11 & 0xffff) / 3) & 0xfffe) * 3)) ||
       (((short)uVar11 != (short)((short)((uVar11 & 0xffff) / 3) * 3) & (byte)uVar11) != 0)) {
      _Var1 = roaring_bitmap_contains(prVar4,uVar11);
      __format = "surplus %d\n";
      if (_Var1) goto LAB_0010642a;
    }
    else {
      iVar10 = iVar10 + 1;
      _Var1 = roaring_bitmap_contains(prVar4,uVar11);
      __format = "missing %d\n";
      if (!_Var1) {
LAB_0010642a:
        printf(__format,(ulong)uVar11);
      }
    }
    uVar11 = uVar11 + 1;
    if (uVar11 == 300) {
      uVar5 = roaring_bitmap_get_cardinality(prVar4);
      _assert_int_equal(uVar5,(long)iVar10,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                        ,0x822);
      roaring_bitmap_free(prVar4);
      roaring_bitmap_free(prVar3);
      roaring_bitmap_free(prVar2);
      prVar2 = gen_bitmap(0.0,1e-06,1,0,0,1000000);
      local_80[0] = gen_bitmap(1.0,-1e-06,1,0,0,1000000);
      local_80[1] = gen_bitmap(1e-05,0.0,1,0,0,2000000);
      local_80[2] = gen_bitmap(1e-05,0.0,3,0,0,2000000);
      local_80[3] = gen_bitmap(0.1,0.0,1,0,0,2000000);
      local_60 = gen_bitmap(0.001,1e-07,1,0,0,1000000);
      local_58 = gen_bitmap(0.0,1e-10,1,0,0,1000000);
      local_50 = gen_bitmap(0.5,-1e-06,1,600000,800000,1000000);
      local_48 = gen_bitmap(1.0,-1e-06,1,300000,500000,1000000);
      local_40 = 0;
      if (prVar2 != (roaring_bitmap_t *)0x0) {
        uVar9 = 0;
        prVar3 = prVar2;
        prVar4 = prVar2;
        uVar7 = uVar9;
        do {
          do {
            r1 = synthesized_xor(prVar4,prVar3);
            prVar3 = roaring_bitmap_lazy_xor(prVar4,prVar3);
            roaring_bitmap_repair_after_lazy(prVar3);
            _Var1 = roaring_bitmap_equals(r1,prVar3);
            if (!_Var1) {
              printf("problem with i=%d j=%d\n",uVar7 & 0xffffffff,uVar9 & 0xffffffff);
              uVar5 = roaring_bitmap_get_cardinality(prVar3);
              uVar6 = roaring_bitmap_get_cardinality(r1);
              printf("result\'s cardinality  is %d and expected\'s is %d\n",uVar5 & 0xffffffff,
                     uVar6 & 0xffffffff);
              show_difference(prVar3,r1);
            }
            _assert_true((ulong)_Var1,"is_equal",
                         "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                         ,0x84f);
            roaring_bitmap_free(r1);
            roaring_bitmap_free(prVar3);
            pprVar8 = local_80 + uVar9;
            uVar9 = uVar9 + 1;
            prVar3 = *pprVar8;
          } while (*pprVar8 != (roaring_bitmap_t *)0x0);
          prVar3 = local_80[uVar7];
          uVar9 = uVar7 + 1;
          prVar4 = prVar3;
          uVar7 = uVar9;
        } while (prVar3 != (roaring_bitmap_t *)0x0);
        if (prVar2 != (roaring_bitmap_t *)0x0) {
          pprVar8 = local_80;
          do {
            roaring_bitmap_free(prVar2);
            prVar2 = *pprVar8;
            pprVar8 = pprVar8 + 1;
          } while (prVar2 != (roaring_bitmap_t *)0x0);
        }
      }
      return;
    }
  } while( true );
}

Assistant:

void test_xor_lazy(bool copy_on_write) {
    roaring_bitmap_t *r1 = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(r1, copy_on_write);
    roaring_bitmap_t *r2 = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(r2, copy_on_write);

    for (uint32_t i = 0; i < 300; ++i) {
        if (i % 2 == 0) roaring_bitmap_add(r1, i);
        if (i % 3 == 0) roaring_bitmap_add(r2, i);
    }

    roaring_bitmap_t *r1_xor_r2 = roaring_bitmap_lazy_xor(r1, r2);
    roaring_bitmap_repair_after_lazy(r1_xor_r2);

    roaring_bitmap_set_copy_on_write(r1_xor_r2, copy_on_write);

    int ansctr = 0;
    for (int i = 0; i < 300; ++i) {
        if (((i % 2 == 0) || (i % 3 == 0)) && (i % 6 != 0)) {
            ansctr++;
            if (!roaring_bitmap_contains(r1_xor_r2, i))
                printf("missing %d\n", i);
        } else if (roaring_bitmap_contains(r1_xor_r2, i))
            printf("surplus %d\n", i);
    }

    assert_int_equal(roaring_bitmap_get_cardinality(r1_xor_r2), ansctr);

    roaring_bitmap_free(r1_xor_r2);
    roaring_bitmap_free(r2);
    roaring_bitmap_free(r1);

    // some tougher tests on synthetic data
    roaring_bitmap_t *r[] = {
        // ascending density, last containers might be runs
        gen_bitmap(0.0, 1e-6, 1, 0, 0, 1000000),
        // descending density, first containers might be runs
        gen_bitmap(1.0, -1e-6, 1, 0, 0, 1000000),
        // uniformly rather sparse
        gen_bitmap(1e-5, 0.0, 1, 0, 0, 2000000),
        // uniformly rather sparse with runs
        gen_bitmap(1e-5, 0.0, 3, 0, 0, 2000000),
        // uniformly rather dense
        gen_bitmap(1e-1, 0.0, 1, 0, 0, 2000000),
        // ascending density but never too dense
        gen_bitmap(0.001, 1e-7, 1, 0, 0, 1000000),
        // ascending density but very sparse
        gen_bitmap(0.0, 1e-10, 1, 0, 0, 1000000),
        // descending with a gap
        gen_bitmap(0.5, -1e-6, 1, 600000, 800000, 1000000),
        //  gap elsewhere
        gen_bitmap(1, -1e-6, 1, 300000, 500000, 1000000),
        0  // sentinel
    };

    for (int i = 0; r[i]; ++i) {
        for (int j = i; r[j]; ++j) {
            roaring_bitmap_t *expected = synthesized_xor(r[i], r[j]);

            roaring_bitmap_t *result = roaring_bitmap_lazy_xor(r[i], r[j]);
            roaring_bitmap_repair_after_lazy(result);

            bool is_equal = roaring_bitmap_equals(expected, result);
            if (!is_equal) {
                printf("problem with i=%d j=%d\n", i, j);
                printf("result's cardinality  is %d and expected's is %d\n",
                       (int)roaring_bitmap_get_cardinality(result),
                       (int)roaring_bitmap_get_cardinality(expected));
                show_difference(result, expected);
            }

            assert_true(is_equal);
            roaring_bitmap_free(expected);
            roaring_bitmap_free(result);
        }
    }
    for (int i = 0; r[i]; ++i) roaring_bitmap_free(r[i]);
}